

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::SerializeWithCachedSizes
          (BorderAmounts_EdgeSizes *this,CodedOutputStream *output)

{
  uint64 uVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BorderAmounts_EdgeSizes *this_local;
  
  uVar1 = startedgesize(this);
  if (uVar1 != 0) {
    uVar1 = startedgesize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  uVar1 = endedgesize(this);
  if (uVar1 != 0) {
    uVar1 = endedgesize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar1,output);
  }
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 startEdgeSize = 1;
  if (this->startedgesize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->startedgesize(), output);
  }

  // uint64 endEdgeSize = 2;
  if (this->endedgesize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->endedgesize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BorderAmounts.EdgeSizes)
}